

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O1

size_t readback_part(curl_mimepart *part,char *buffer,size_t bufsize,_Bool *hasread)

{
  char *__dest;
  void **ppvVar1;
  size_t *psVar2;
  curl_off_t *pcVar3;
  mimestate mVar4;
  _Bool _Var5;
  bool bVar6;
  size_t sVar7;
  char *pcVar8;
  curl_slist *pcVar9;
  ulong uVar10;
  size_t sVar11;
  size_t __n;
  size_t sVar12;
  size_t local_60;
  size_t local_58;
  char *local_50;
  
  __dest = (part->encstate).buf;
  ppvVar1 = &(part->state).ptr;
  sVar12 = 0;
LAB_005b58d6:
  if (bufsize == 0) {
    return sVar12;
  }
  mVar4 = (part->state).state;
  __n = 0;
  if (MIMESTATE_END < mVar4) goto switchD_005b5906_caseD_5;
  pcVar9 = (curl_slist *)(part->state).ptr;
  switch(mVar4) {
  case MIMESTATE_BEGIN:
    pcVar9 = part->curlheaders;
    (part->state).state = ((part->flags & 2) >> 1) * 3 + MIMESTATE_CURLHEADERS;
    (part->state).ptr = pcVar9;
    goto LAB_005b5c6b;
  case MIMESTATE_CURLHEADERS:
switchD_005b5906_caseD_1:
    if (pcVar9 == (curl_slist *)0x0) {
      pcVar9 = part->userheaders;
LAB_005b5b73:
      (part->state).state = MIMESTATE_USERHEADERS;
    }
    else {
      pcVar8 = pcVar9->data;
      sVar11 = strlen(pcVar8);
      sVar7 = curlx_sotouz((part->state).offset);
      uVar10 = sVar7 - sVar11;
      if (sVar7 < sVar11) {
        __n = sVar11 - sVar7;
        pcVar8 = pcVar8 + sVar7;
LAB_005b5b9e:
        if (bufsize <= __n) {
          __n = bufsize;
        }
        memcpy(buffer,pcVar8,__n);
        pcVar3 = &(part->state).offset;
        *pcVar3 = *pcVar3 + __n;
      }
      else {
        if (uVar10 < 2) {
          pcVar8 = " \t\r\n" + uVar10 + 2;
          __n = 2 - uVar10;
          goto LAB_005b5b9e;
        }
        __n = 0;
      }
      if (__n != 0) break;
      pcVar9 = pcVar9->next;
    }
    (part->state).ptr = pcVar9;
LAB_005b5c6b:
    (part->state).offset = 0;
LAB_005b5c77:
    __n = 0;
    break;
  case MIMESTATE_USERHEADERS:
    if (pcVar9 != (curl_slist *)0x0) {
      pcVar8 = match_header(pcVar9,"Content-Type",0xc);
      if (pcVar8 == (char *)0x0) goto switchD_005b5906_caseD_1;
      pcVar9 = pcVar9->next;
      goto LAB_005b5b73;
    }
    (part->state).state = MIMESTATE_EOH;
    goto LAB_005b5c13;
  case MIMESTATE_EOH:
    sVar7 = curlx_sotouz((part->state).offset);
    if (sVar7 < 2) {
      __n = 2 - sVar7;
      if (bufsize <= 2 - sVar7) {
        __n = bufsize;
      }
      memcpy(buffer," \t\r\n" + sVar7 + 2,__n);
      pcVar3 = &(part->state).offset;
      *pcVar3 = *pcVar3 + __n;
    }
    else {
      __n = 0;
    }
    if (__n == 0) {
      (part->state).state = MIMESTATE_BODY;
      goto LAB_005b5c13;
    }
    break;
  case MIMESTATE_BODY:
    (part->encstate).pos = 0;
    (part->encstate).bufbeg = 0;
    (part->encstate).bufend = 0;
    (part->state).state = MIMESTATE_CONTENT;
LAB_005b5c13:
    *ppvVar1 = (void *)0x0;
    (part->state).offset = 0;
    goto LAB_005b5c77;
  case MIMESTATE_CONTENT:
    if (part->encoder != (mime_encoder *)0x0) {
      __n = 0;
      _Var5 = false;
      local_58 = bufsize;
      local_50 = buffer;
      do {
        while ((bool)((part->encstate).bufbeg < (part->encstate).bufend | _Var5)) {
          sVar7 = (*part->encoder->encodefunc)(local_50,local_58,_Var5,part);
          if (sVar7 == 0) {
            if (_Var5 == false) break;
            goto LAB_005b5bd8;
          }
          if (sVar7 + 2 < 2) goto LAB_005b5b60;
          __n = __n + sVar7;
          local_50 = local_50 + sVar7;
          local_58 = local_58 - sVar7;
        }
        sVar7 = (part->encstate).bufbeg;
        if (sVar7 != 0) {
          sVar11 = (part->encstate).bufend - sVar7;
          if (sVar11 != 0) {
            memmove(__dest,__dest + sVar7,sVar11);
          }
          (part->encstate).bufbeg = 0;
          (part->encstate).bufend = sVar11;
        }
        uVar10 = (part->encstate).bufend;
        if (0xff < uVar10) {
          __n = __n | -(ulong)(__n == 0);
          goto LAB_005b5bd8;
        }
        sVar7 = read_part_content(part,__dest + uVar10,0x100 - uVar10,hasread);
        if ((sVar7 + 2 < 2) || (sVar7 - 0x10000000 < 2)) goto LAB_005b5b60;
        if (sVar7 == 0) {
          _Var5 = true;
        }
        else {
          psVar2 = &(part->encstate).bufend;
          *psVar2 = *psVar2 + sVar7;
        }
      } while( true );
    }
    __n = read_part_content(part,buffer,bufsize,hasread);
    goto LAB_005b5bd8;
  case MIMESTATE_END:
    bVar6 = false;
    local_60 = sVar12;
    goto LAB_005b5c84;
  }
  goto switchD_005b5906_caseD_5;
LAB_005b5b60:
  if (__n == 0) {
    __n = sVar7;
  }
LAB_005b5bd8:
  if ((1 < __n + 2) && (1 < __n - 0x10000000)) {
    if (__n != 0) {
switchD_005b5906_caseD_5:
      sVar12 = sVar12 + __n;
      buffer = buffer + __n;
      bufsize = bufsize - __n;
      bVar6 = true;
      goto LAB_005b5c84;
    }
    (part->state).state = MIMESTATE_END;
    *ppvVar1 = (void *)0x0;
    (part->state).offset = 0;
    if ((part->kind == MIMEKIND_FILE) && ((FILE *)part->fp != (FILE *)0x0)) {
      fclose((FILE *)part->fp);
      part->fp = (FILE *)0x0;
    }
  }
  local_60 = __n;
  if (sVar12 != 0) {
    local_60 = sVar12;
  }
  bVar6 = false;
LAB_005b5c84:
  if (!bVar6) {
    return local_60;
  }
  goto LAB_005b58d6;
}

Assistant:

static size_t readback_part(curl_mimepart *part,
                            char *buffer, size_t bufsize, bool *hasread)
{
  size_t cursize = 0;

  /* Readback from part. */

  while(bufsize) {
    size_t sz = 0;
    struct curl_slist *hdr = (struct curl_slist *) part->state.ptr;
    switch(part->state.state) {
    case MIMESTATE_BEGIN:
      mimesetstate(&part->state,
                   (part->flags & MIME_BODY_ONLY)?
                     MIMESTATE_BODY: MIMESTATE_CURLHEADERS,
                   part->curlheaders);
      break;
    case MIMESTATE_USERHEADERS:
      if(!hdr) {
        mimesetstate(&part->state, MIMESTATE_EOH, NULL);
        break;
      }
      if(match_header(hdr, "Content-Type", 12)) {
        mimesetstate(&part->state, MIMESTATE_USERHEADERS, hdr->next);
        break;
      }
      FALLTHROUGH();
    case MIMESTATE_CURLHEADERS:
      if(!hdr)
        mimesetstate(&part->state, MIMESTATE_USERHEADERS, part->userheaders);
      else {
        sz = readback_bytes(&part->state, buffer, bufsize,
                            hdr->data, strlen(hdr->data), STRCONST("\r\n"));
        if(!sz)
          mimesetstate(&part->state, part->state.state, hdr->next);
      }
      break;
    case MIMESTATE_EOH:
      sz = readback_bytes(&part->state, buffer, bufsize, STRCONST("\r\n"),
                          STRCONST(""));
      if(!sz)
        mimesetstate(&part->state, MIMESTATE_BODY, NULL);
      break;
    case MIMESTATE_BODY:
      cleanup_encoder_state(&part->encstate);
      mimesetstate(&part->state, MIMESTATE_CONTENT, NULL);
      break;
    case MIMESTATE_CONTENT:
      if(part->encoder)
        sz = read_encoded_part_content(part, buffer, bufsize, hasread);
      else
        sz = read_part_content(part, buffer, bufsize, hasread);
      switch(sz) {
      case 0:
        mimesetstate(&part->state, MIMESTATE_END, NULL);
        /* Try sparing open file descriptors. */
        if(part->kind == MIMEKIND_FILE && part->fp) {
          fclose(part->fp);
          part->fp = NULL;
        }
        FALLTHROUGH();
      case CURL_READFUNC_ABORT:
      case CURL_READFUNC_PAUSE:
      case READ_ERROR:
      case STOP_FILLING:
        return cursize? cursize: sz;
      }
      break;
    case MIMESTATE_END:
      return cursize;
    default:
      break;    /* Other values not in part state. */
    }

    /* Bump buffer and counters according to read size. */
    cursize += sz;
    buffer += sz;
    bufsize -= sz;
  }

  return cursize;
}